

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling.cpp
# Opt level: O0

ScaleAndOrigin QHighDpiScaling::scaleAndOrigin(QScreen *screen,Point position)

{
  long lVar1;
  Point position_00;
  undefined4 in_EDX;
  Representation in_ESI;
  QPlatformScreen *in_RDI;
  long in_FS_OFFSET;
  ScaleAndOrigin SVar2;
  QPoint *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 local_18 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (m_active) {
    if (in_RDI == (QPlatformScreen *)0x0) {
      local_18._8_8_ = local_18._0_8_;
      local_18._0_8_ = m_factor;
      QPoint::QPoint(in_stack_ffffffffffffffa0);
    }
    else {
      QScreen::handle((QScreen *)in_stack_ffffffffffffffa0);
      position_00.point.xp.m_i = in_stack_ffffffffffffffd8;
      position_00.kind = in_EDX;
      position_00.point.yp.m_i = in_ESI.m_i;
      local_18 = (undefined1  [16])scaleAndOrigin(in_RDI,position_00);
    }
  }
  else {
    local_18._8_8_ = local_18._0_8_;
    local_18._0_8_ = 1.0;
    QPoint::QPoint(in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    SVar2.factor = (qreal)local_18._0_8_;
    SVar2.origin.xp.m_i = local_18._8_4_;
    SVar2.origin.yp.m_i = local_18._12_4_;
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

QHighDpiScaling::ScaleAndOrigin QHighDpiScaling::scaleAndOrigin(const QScreen *screen, QHighDpiScaling::Point position)
{
    Q_UNUSED(position)
    if (!m_active)
        return { qreal(1), QPoint() };
    if (!screen)
        return { m_factor, QPoint() }; // the global factor
    return scaleAndOrigin(screen->handle(), position);
}